

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

uint32_t Keyset::xorShift(uint32_t x,uint32_t y)

{
  int iVar1;
  uint32_t result;
  bool bVar2;
  
  iVar1 = 0x20;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    x = (int)x >> 0x1f & y ^ x * 2;
  }
  return x;
}

Assistant:

static uint32_t xorShift(uint32_t x, uint32_t y)
	{
		auto result = x;
		const auto count = sizeof(x) * CHAR_BIT;
		for (auto i = 0u; i < count; ++i) {
			const auto hasUpperBit = (result & UINT32_C(0x80000000)) != 0;
			result <<= 1;
			if (hasUpperBit) {
				result ^= y;
			}
		}
		return result;
	}